

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vtabCallConstructor(sqlite3 *db,Table *pTab,Module *pMod,
                       _func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr
                       *xConstruct,char **pzErr)

{
  u8 *puVar1;
  char **ppcVar2;
  VtabCtx *pVVar3;
  sqlite3_vtab *psVar4;
  VTable *pVTab;
  byte bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  VtabCtx **ppVVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  sqlite3_vtab **ppsVar15;
  char *zErr;
  VTable *local_60;
  char *local_58;
  VtabCtx sCtx;
  
  ppcVar2 = pTab->azModuleArg;
  iVar7 = pTab->nModuleArg;
  zErr = (char *)0x0;
  ppVVar9 = &db->pVtabCtx;
  while (pVVar3 = *ppVVar9, pVVar3 != (VtabCtx *)0x0) {
    ppVVar9 = &pVVar3->pPrior;
    if (pVVar3->pTab == pTab) {
      pcVar10 = sqlite3MPrintf(db,"vtable constructor called recursively: %s",pTab->zName);
      *pzErr = pcVar10;
      return 6;
    }
  }
  pcVar10 = sqlite3DbStrDup(db,pTab->zName);
  if (pcVar10 == (char *)0x0) {
    return 7;
  }
  local_60 = (VTable *)sqlite3MallocZero(0x30);
  if (local_60 == (VTable *)0x0) {
    sqlite3OomFault(db);
    sqlite3DbFreeNN(db,pcVar10);
    return 7;
  }
  local_60->db = db;
  local_60->pMod = pMod;
  local_58 = pcVar10;
  iVar6 = sqlite3SchemaToIndex(db,pTab->pSchema);
  pTab->azModuleArg[1] = db->aDb[iVar6].zDbSName;
  sCtx.pPrior = db->pVtabCtx;
  sCtx.bDeclared = 0;
  db->pVtabCtx = &sCtx;
  ppsVar15 = &local_60->pVtab;
  sCtx.pVTable = local_60;
  sCtx.pTab = pTab;
  iVar7 = (*xConstruct)(db,pMod->pAux,iVar7,ppcVar2,ppsVar15,&zErr);
  pVTab = local_60;
  db->pVtabCtx = sCtx.pPrior;
  if (iVar7 == 0) {
    psVar4 = *ppsVar15;
    if (psVar4 == (sqlite3_vtab *)0x0) {
      iVar7 = 0;
    }
    else {
      psVar4->zErrMsg = (char *)0x0;
      psVar4->pModule = (sqlite3_module *)0x0;
      *(undefined8 *)&psVar4->nRef = 0;
      local_60->pVtab->pModule = pMod->pModule;
      local_60->nRef = 1;
      if (sCtx.bDeclared == 0) {
        pcVar10 = sqlite3MPrintf(db,"vtable constructor did not declare schema: %s",pTab->zName);
        *pzErr = pcVar10;
        sqlite3VtabUnlock(pVTab);
        iVar7 = 1;
      }
      else {
        local_60->pNext = pTab->pVTable;
        pTab->pVTable = local_60;
        bVar5 = 0;
        for (lVar12 = 0; lVar12 < pTab->nCol; lVar12 = lVar12 + 1) {
          pcVar10 = sqlite3ColumnType(pTab->aCol + lVar12,"");
          uVar8 = sqlite3Strlen30(pcVar10);
          uVar14 = 0;
LAB_0014f2ee:
          if (uVar8 == uVar14) {
            pTab->tabFlags = pTab->tabFlags | (uint)bVar5;
          }
          else {
            iVar7 = sqlite3_strnicmp("hidden",pcVar10 + uVar14,6);
            if ((iVar7 != 0) ||
               (((uVar14 != 0 && (pcVar10[uVar14 - 1] != ' ')) ||
                ((pcVar10[uVar14 + 6] & 0xdfU) != 0)))) goto LAB_0014f31d;
            lVar11 = 7 - (ulong)(pcVar10[uVar14 + 6] == 0);
            for (uVar13 = uVar14; lVar11 + uVar13 <= (ulong)uVar8; uVar13 = uVar13 + 1) {
              pcVar10[uVar13] = pcVar10[uVar13 + lVar11];
            }
            if ((uVar14 != 0) && (pcVar10[uVar14] == '\0')) {
              pcVar10[uVar14 - 1] = '\0';
            }
            puVar1 = &pTab->aCol[lVar12].colFlags;
            *puVar1 = *puVar1 | 2;
            bVar5 = 0x80;
          }
        }
        iVar7 = 0;
      }
    }
  }
  else {
    if (iVar7 == 7) {
      sqlite3OomFault(db);
    }
    if (zErr == (char *)0x0) {
      pcVar10 = sqlite3MPrintf(db,"vtable constructor failed: %s",local_58);
      *pzErr = pcVar10;
    }
    else {
      pcVar10 = sqlite3MPrintf(db,"%s");
      *pzErr = pcVar10;
      sqlite3_free(zErr);
    }
    sqlite3DbFreeNN(db,local_60);
  }
  sqlite3DbFreeNN(db,local_58);
  return iVar7;
LAB_0014f31d:
  uVar14 = uVar14 + 1;
  goto LAB_0014f2ee;
}

Assistant:

static int vtabCallConstructor(
  sqlite3 *db, 
  Table *pTab,
  Module *pMod,
  int (*xConstruct)(sqlite3*,void*,int,const char*const*,sqlite3_vtab**,char**),
  char **pzErr
){
  VtabCtx sCtx;
  VTable *pVTable;
  int rc;
  const char *const*azArg = (const char *const*)pTab->azModuleArg;
  int nArg = pTab->nModuleArg;
  char *zErr = 0;
  char *zModuleName;
  int iDb;
  VtabCtx *pCtx;

  /* Check that the virtual-table is not already being initialized */
  for(pCtx=db->pVtabCtx; pCtx; pCtx=pCtx->pPrior){
    if( pCtx->pTab==pTab ){
      *pzErr = sqlite3MPrintf(db, 
          "vtable constructor called recursively: %s", pTab->zName
      );
      return SQLITE_LOCKED;
    }
  }

  zModuleName = sqlite3DbStrDup(db, pTab->zName);
  if( !zModuleName ){
    return SQLITE_NOMEM_BKPT;
  }

  pVTable = sqlite3MallocZero(sizeof(VTable));
  if( !pVTable ){
    sqlite3OomFault(db);
    sqlite3DbFree(db, zModuleName);
    return SQLITE_NOMEM_BKPT;
  }
  pVTable->db = db;
  pVTable->pMod = pMod;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  pTab->azModuleArg[1] = db->aDb[iDb].zDbSName;

  /* Invoke the virtual table constructor */
  assert( &db->pVtabCtx );
  assert( xConstruct );
  sCtx.pTab = pTab;
  sCtx.pVTable = pVTable;
  sCtx.pPrior = db->pVtabCtx;
  sCtx.bDeclared = 0;
  db->pVtabCtx = &sCtx;
  rc = xConstruct(db, pMod->pAux, nArg, azArg, &pVTable->pVtab, &zErr);
  db->pVtabCtx = sCtx.pPrior;
  if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
  assert( sCtx.pTab==pTab );

  if( SQLITE_OK!=rc ){
    if( zErr==0 ){
      *pzErr = sqlite3MPrintf(db, "vtable constructor failed: %s", zModuleName);
    }else {
      *pzErr = sqlite3MPrintf(db, "%s", zErr);
      sqlite3_free(zErr);
    }
    sqlite3DbFree(db, pVTable);
  }else if( ALWAYS(pVTable->pVtab) ){
    /* Justification of ALWAYS():  A correct vtab constructor must allocate
    ** the sqlite3_vtab object if successful.  */
    memset(pVTable->pVtab, 0, sizeof(pVTable->pVtab[0]));
    pVTable->pVtab->pModule = pMod->pModule;
    pVTable->nRef = 1;
    if( sCtx.bDeclared==0 ){
      const char *zFormat = "vtable constructor did not declare schema: %s";
      *pzErr = sqlite3MPrintf(db, zFormat, pTab->zName);
      sqlite3VtabUnlock(pVTable);
      rc = SQLITE_ERROR;
    }else{
      int iCol;
      u8 oooHidden = 0;
      /* If everything went according to plan, link the new VTable structure
      ** into the linked list headed by pTab->pVTable. Then loop through the 
      ** columns of the table to see if any of them contain the token "hidden".
      ** If so, set the Column COLFLAG_HIDDEN flag and remove the token from
      ** the type string.  */
      pVTable->pNext = pTab->pVTable;
      pTab->pVTable = pVTable;

      for(iCol=0; iCol<pTab->nCol; iCol++){
        char *zType = sqlite3ColumnType(&pTab->aCol[iCol], "");
        int nType;
        int i = 0;
        nType = sqlite3Strlen30(zType);
        for(i=0; i<nType; i++){
          if( 0==sqlite3StrNICmp("hidden", &zType[i], 6)
           && (i==0 || zType[i-1]==' ')
           && (zType[i+6]=='\0' || zType[i+6]==' ')
          ){
            break;
          }
        }
        if( i<nType ){
          int j;
          int nDel = 6 + (zType[i+6] ? 1 : 0);
          for(j=i; (j+nDel)<=nType; j++){
            zType[j] = zType[j+nDel];
          }
          if( zType[i]=='\0' && i>0 ){
            assert(zType[i-1]==' ');
            zType[i-1] = '\0';
          }
          pTab->aCol[iCol].colFlags |= COLFLAG_HIDDEN;
          oooHidden = TF_OOOHidden;
        }else{
          pTab->tabFlags |= oooHidden;
        }
      }
    }
  }

  sqlite3DbFree(db, zModuleName);
  return rc;
}